

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

int quicly_sendbuf_write_vec(quicly_stream_t *stream,quicly_sendbuf_t *sb,quicly_sendbuf_vec_t *vec)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  quicly_sendbuf_vec_t *pqVar5;
  size_t sVar6;
  
  uVar1 = (sb->vecs).capacity;
  uVar2 = (sb->vecs).size;
  if (uVar1 < uVar2) {
    __assert_fail("sb->vecs.size <= sb->vecs.capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x9c,
                  "int quicly_sendbuf_write_vec(quicly_stream_t *, quicly_sendbuf_t *, quicly_sendbuf_vec_t *)"
                 );
  }
  if (uVar2 == uVar1) {
    sVar6 = 4;
    if (uVar1 != 0) {
      sVar6 = uVar1 * 2;
    }
    pqVar5 = (quicly_sendbuf_vec_t *)realloc((sb->vecs).entries,sVar6 * 0x18);
    if (pqVar5 == (quicly_sendbuf_vec_t *)0x0) {
      return 0x201;
    }
    (sb->vecs).entries = pqVar5;
    (sb->vecs).capacity = sVar6;
  }
  pqVar5 = (sb->vecs).entries;
  sVar6 = (sb->vecs).size;
  (sb->vecs).size = sVar6 + 1;
  pqVar5[sVar6].cbdata = vec->cbdata;
  sVar3 = vec->len;
  pqVar5 = pqVar5 + sVar6;
  pqVar5->cb = vec->cb;
  pqVar5->len = sVar3;
  sb->bytes_written = sb->bytes_written + vec->len;
  iVar4 = quicly_stream_sync_sendbuf(stream,1);
  return iVar4;
}

Assistant:

int quicly_sendbuf_write_vec(quicly_stream_t *stream, quicly_sendbuf_t *sb, quicly_sendbuf_vec_t *vec)
{
    assert(sb->vecs.size <= sb->vecs.capacity);

    if (sb->vecs.size == sb->vecs.capacity) {
        quicly_sendbuf_vec_t *new_entries;
        size_t new_capacity = sb->vecs.capacity == 0 ? 4 : sb->vecs.capacity * 2;
        if ((new_entries = realloc(sb->vecs.entries, new_capacity * sizeof(*sb->vecs.entries))) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        sb->vecs.entries = new_entries;
        sb->vecs.capacity = new_capacity;
    }
    sb->vecs.entries[sb->vecs.size++] = *vec;
    sb->bytes_written += vec->len;

    return quicly_stream_sync_sendbuf(stream, 1);
}